

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::run(PassRunner *this)

{
  PassRunner **ppPVar1;
  pointer puVar2;
  Function *func;
  bool bVar3;
  int iVar4;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  ostream *poVar5;
  pointer puVar6;
  long lVar7;
  size_type sVar8;
  byte bVar9;
  undefined8 in_RCX;
  Module *wasm;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_1;
  pointer puVar11;
  Module *pMVar12;
  __node_base *p_Var13;
  size_t i;
  char *pcVar14;
  pointer puVar15;
  Name name;
  Name name_00;
  undefined1 local_3c0 [8];
  anon_class_16_2_032a43cd flush;
  undefined1 auStack_238 [8];
  stringstream moduleBefore;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [24];
  Name local_a8;
  _Head_base<0UL,_wasm::Pass_*,_false> local_98 [4];
  IString local_78;
  pointer local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_60;
  char *local_58;
  PassOptions *local_50;
  double local_48;
  double local_40;
  PassRunner *local_38;
  Module *pMVar10;
  
  if (this->ran == true) {
    __assert_fail("!ran",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x2b8,"void wasm::PassRunner::run()");
  }
  this->ran = true;
  local_60 = &(this->skippedPasses)._M_h;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear(local_60);
  if ((run()::passDebug == '\0') && (iVar4 = __cxa_guard_acquire(&run()::passDebug), iVar4 != 0)) {
    run::passDebug = getPassDebug();
    __cxa_guard_release(&run()::passDebug);
  }
  bVar9 = run::passDebug == 2 | (this->options).debug;
  pMVar10 = (Module *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar9);
  local_38 = this;
  if (bVar9 == 1) {
    pcVar14 = "passes";
    if ((this->isNested & 1U) != 0) {
      pcVar14 = "nested passes";
    }
  }
  else {
    if ((run::passDebug == 0) || (this->isNested != false)) {
      local_228[0]._M_allocated_capacity = (pointer)0x0;
      auStack_238 = (undefined1  [8])0x0;
      _moduleBefore = (pointer)0x0;
      puVar6 = (this->passes).
               super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_3c0 = (undefined1  [8])auStack_238;
      flush.stack = (vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)this;
      for (puVar11 = (this->passes).
                     super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar6;
          puVar11 = puVar11 + 1) {
        iVar4 = (*((puVar11->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
        if ((char)iVar4 == '\0') {
          run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_3c0);
          runPass(local_38,(puVar11->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
        }
        else {
          local_98[0]._M_head_impl =
               (puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
          std::vector<wasm::Pass*,std::allocator<wasm::Pass*>>::emplace_back<wasm::Pass*>
                    ((vector<wasm::Pass*,std::allocator<wasm::Pass*>> *)auStack_238,
                     &local_98[0]._M_head_impl);
        }
      }
      run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_3c0);
      std::_Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>::~_Vector_base
                ((_Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)auStack_238);
      this = local_38;
      goto LAB_007b1fa7;
    }
    pcVar14 = "passes";
  }
  local_50 = &this->options;
  poVar5 = std::operator<<((ostream *)&std::cerr,"[PassRunner] running ");
  poVar5 = std::operator<<(poVar5,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar5);
  local_68 = (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pMVar12 = (Module *)0x0;
  puVar11 = (this->passes).
            super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (puVar6 = puVar11; puVar6 != local_68; puVar6 = puVar6 + 1) {
    pMVar10 = (Module *)
              (((puVar6->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
                _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length;
    if (pMVar12 <= pMVar10) {
      pMVar12 = pMVar10;
    }
  }
  local_58 = pcVar14;
  if ((2 < run::passDebug) && (this->isNested == false)) {
    Name::Name(&local_a8,"before");
    name.super_IString.str._M_str = (char *)this->wasm;
    name.super_IString.str._M_len = (size_t)local_a8.super_IString.str._M_str;
    dumpWasm((wasm *)local_a8.super_IString.str._M_len,name,pMVar10);
    puVar11 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (this->passes).
               super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_48 = 0.0;
  for (; puVar11 != local_68; puVar11 = puVar11 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
    if ((run::passDebug == 2) && (this->isNested == false)) {
      poVar5 = std::operator<<((ostream *)local_228[0]._M_local_buf,this->wasm);
      std::operator<<(poVar5,'\n');
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"[PassRunner]   running pass: ");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &((puVar11->_M_t).
                                      super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                      .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->
                                     name);
    std::operator<<(poVar5,"... ");
    for (pMVar10 = (Module *)0x0;
        wasm = (Module *)
               ((long)pMVar12 -
               (((puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                 ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name)._M_string_length),
        pMVar10 < wasm;
        pMVar10 = (Module *)
                  ((long)&(pMVar10->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1)) {
      std::operator<<((ostream *)&std::cerr,' ');
    }
    local_40 = (double)std::chrono::_V2::steady_clock::now();
    iVar4 = (*((puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
    if ((char)iVar4 == '\0') {
      runPass(local_38,(puVar11->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
    }
    else {
      puVar2 = (local_38->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar15 = (local_38->wasm->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
          puVar15 = puVar15 + 1) {
        func = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          runPassOnFunction(local_38,(puVar11->_M_t).
                                     super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                     .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,func);
        }
      }
    }
    lVar7 = std::chrono::_V2::steady_clock::now();
    local_40 = (double)(lVar7 - (long)local_40) / 1000000000.0;
    poVar5 = std::ostream::_M_insert<double>(local_40);
    this = local_38;
    poVar5 = std::operator<<(poVar5," seconds.");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (((this->options).validate == true) && (this->isNested == false)) {
      std::operator<<((ostream *)&std::cerr,"[PassRunner]   (validating)\n");
      bVar3 = WasmValidator::validate((WasmValidator *)local_3c0,this->wasm,local_50);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cout,this->wasm);
        std::operator<<(poVar5,'\n');
        if (run::passDebug < 2) {
          Fatal::Fatal((Fatal *)local_3c0);
          std::operator<<((ostream *)&flush.this,"Last pass (");
          std::operator<<((ostream *)&flush.this,
                          (string *)
                          &((puVar11->_M_t).
                            super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
                            .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
          Fatal::operator<<((Fatal *)local_3c0,
                            (char (*) [128])
                            ") broke validation. Run with BINARYEN_PASS_DEBUG=2 in the env to see the earlier state, or 3 to dump byn-* files for each pass\n"
                           );
        }
        else {
          Fatal::Fatal((Fatal *)local_3c0);
          ppPVar1 = &flush.this;
          std::operator<<((ostream *)ppPVar1,"Last pass (");
          std::operator<<((ostream *)ppPVar1,
                          (string *)
                          &((puVar11->_M_t).
                            super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
                            .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
          std::operator<<((ostream *)ppPVar1,") broke validation. Here is the module before: \n");
          std::__cxx11::stringbuf::str();
          std::operator<<((ostream *)ppPVar1,(string *)local_98);
          Fatal::operator<<((Fatal *)local_3c0,(char (*) [2])0xbe49ff);
          std::__cxx11::string::~string((string *)local_98);
        }
        Fatal::~Fatal((Fatal *)local_3c0);
      }
    }
    if (2 < run::passDebug) {
      IString::IString(&local_78,
                       &((puVar11->_M_t).
                         super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                         super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
      name_00.super_IString.str._M_str = (char *)this->wasm;
      name_00.super_IString.str._M_len = (size_t)local_78.str._M_str;
      dumpWasm((wasm *)local_78.str._M_len,name_00,wasm);
    }
    local_48 = local_48 + local_40;
    std::__cxx11::stringstream::~stringstream((stringstream *)auStack_238);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"[PassRunner] ");
  poVar5 = std::operator<<(poVar5,local_58);
  std::operator<<(poVar5," took ");
  poVar5 = std::ostream::_M_insert<double>(local_48);
  poVar5 = std::operator<<(poVar5," seconds.");
  std::endl<char,std::char_traits<char>>(poVar5);
  if (((this->options).validate != false) && (this->isNested == false)) {
    std::operator<<((ostream *)&std::cerr,"[PassRunner] (final validation)\n");
    bVar3 = WasmValidator::validate((WasmValidator *)auStack_238,this->wasm,local_50);
    if (!bVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,this->wasm);
      std::operator<<(poVar5,'\n');
      Fatal::Fatal((Fatal *)auStack_238);
      Fatal::operator<<((Fatal *)auStack_238,(char (*) [32])"final module does not validate\n");
      Fatal::~Fatal((Fatal *)auStack_238);
    }
  }
LAB_007b1fa7:
  if (this->isNested == false) {
    p_Var13 = &(this->options).passesToSkip._M_h._M_before_begin;
    while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
      std::__cxx11::string::string((string *)auStack_238,(string *)(p_Var13 + 1));
      sVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(local_60,(key_type *)auStack_238);
      if (sVar8 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"warning: --");
        poVar5 = std::operator<<(poVar5,(string *)auStack_238);
        poVar5 = std::operator<<(poVar5," was requested to be skipped, ");
        std::operator<<(poVar5,"but it was not found in the passes that were run.\n");
      }
      std::__cxx11::string::~string((string *)auStack_238);
    }
  }
  return;
}

Assistant:

void PassRunner::run() {
  assert(!ran);
  ran = true;

  // As we run passes, we'll notice which we skip.
  skippedPasses.clear();

  static const int passDebug = getPassDebug();
  // Emit logging information when asked for. At passDebug level 1+ we log
  // the main passes, while in 2 we also log nested ones. Note that for
  // nested ones we can only emit their name - we can't validate, or save the
  // file, or print, as the wasm may be in an intermediate state that is not
  // valid.
  if (options.debug || (passDebug == 2 || (passDebug && !isNested))) {
    // for debug logging purposes, run each pass in full before running the
    // other
    auto totalTime = std::chrono::duration<double>(0);
    auto what = isNested ? "nested passes" : "passes";
    std::cerr << "[PassRunner] running " << what << std::endl;
    size_t padding = 0;
    for (auto& pass : passes) {
      padding = std::max(padding, pass->name.size());
    }
    if (passDebug >= 3 && !isNested) {
      dumpWasm("before", wasm);
    }
    for (auto& pass : passes) {
      // ignoring the time, save a printout of the module before, in case this
      // pass breaks it, so we can print the before and after
      std::stringstream moduleBefore;
      if (passDebug == 2 && !isNested) {
        moduleBefore << *wasm << '\n';
      }
      // prepare to run
      std::cerr << "[PassRunner]   running pass: " << pass->name << "... ";
      for (size_t i = 0; i < padding - pass->name.size(); i++) {
        std::cerr << ' ';
      }
      auto before = std::chrono::steady_clock::now();
      if (pass->isFunctionParallel()) {
        // function-parallel passes should get a new instance per function
        ModuleUtils::iterDefinedFunctions(
          *wasm, [&](Function* func) { runPassOnFunction(pass.get(), func); });
      } else {
        runPass(pass.get());
      }
      auto after = std::chrono::steady_clock::now();
      std::chrono::duration<double> diff = after - before;
      std::cerr << diff.count() << " seconds." << std::endl;
      totalTime += diff;
      if (options.validate && !isNested) {
        // validate, ignoring the time
        std::cerr << "[PassRunner]   (validating)\n";
        if (!WasmValidator().validate(*wasm, options)) {
          std::cout << *wasm << '\n';
          if (passDebug >= 2) {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Here is the module before: \n"
                    << moduleBefore.str() << "\n";
          } else {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Run with BINARYEN_PASS_DEBUG=2 "
                       "in the env to see the earlier state, or 3 to dump "
                       "byn-* files for each pass\n";
          }
        }
      }
      if (passDebug >= 3) {
        dumpWasm(pass->name, wasm);
      }
    }
    std::cerr << "[PassRunner] " << what << " took " << totalTime.count()
              << " seconds." << std::endl;
    if (options.validate && !isNested) {
      std::cerr << "[PassRunner] (final validation)\n";
      if (!WasmValidator().validate(*wasm, options)) {
        std::cout << *wasm << '\n';
        Fatal() << "final module does not validate\n";
      }
    }
  } else {
    // non-debug normal mode, run them in an optimal manner - for locality it is
    // better to run as many passes as possible on a single function before
    // moving to the next
    std::vector<Pass*> stack;
    auto flush = [&]() {
      if (stack.size() > 0) {
        // run the stack of passes on all the functions, in parallel
        size_t num = ThreadPool::get()->size();
        std::vector<std::function<ThreadWorkState()>> doWorkers;
        std::atomic<size_t> nextFunction;
        nextFunction.store(0);
        size_t numFunctions = wasm->functions.size();
        for (size_t i = 0; i < num; i++) {
          doWorkers.push_back([&]() {
            auto index = nextFunction.fetch_add(1);
            // get the next task, if there is one
            if (index >= numFunctions) {
              return ThreadWorkState::Finished; // nothing left
            }
            Function* func = this->wasm->functions[index].get();
            if (!func->imported()) {
              // do the current task: run all passes on this function
              for (auto* pass : stack) {
                runPassOnFunction(pass, func);
              }
            }
            if (index + 1 == numFunctions) {
              return ThreadWorkState::Finished; // we did the last one
            }
            return ThreadWorkState::More;
          });
        }
        ThreadPool::get()->work(doWorkers);
      }
      stack.clear();
    };
    for (auto& pass : passes) {
      if (pass->isFunctionParallel()) {
        stack.push_back(pass.get());
      } else {
        flush();
        runPass(pass.get());
      }
    }
    flush();
  }

  if (!isNested) {
    // All the passes the user requested to skip should have been seen, and
    // skipped. If not, the user may have had a typo in the name of a pass to
    // skip, and we will warn. (We don't do this in a nested runner because
    // those are used for various internal tasks inside passes, which would lead
    // to many spurious warnings.)
    for (auto pass : options.passesToSkip) {
      if (!skippedPasses.count(pass)) {
        std::cerr << "warning: --" << pass << " was requested to be skipped, "
                  << "but it was not found in the passes that were run.\n";
      }
    }
  }
}